

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOM
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,int32_t month,int32_t dayOfMonth,UDate startTime,UDate untilTime,
          UErrorCode *status)

{
  UErrorCode *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_02;
  VTimeZone *pVVar1;
  UnicodeString dstr;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  beginZoneProps(this,writer,isDst,zonename,fromOffset,toOffset,startTime,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  __n = status;
  beginRRULE(this,writer,month,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  VTZWriter::write(writer,0x3090e0,__buf,(size_t)__n);
  VTZWriter::write(writer,0x3d,__buf_00,(size_t)__n);
  dstr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  dstr.fUnion.fStackFields.fLengthAndFlags = 2;
  appendAsciiDigits(dayOfMonth,'\0',&dstr);
  VTZWriter::write(writer,(int)&dstr,__buf_01,(size_t)__n);
  if ((untilTime != 1.838821689216e+17) || (__buf_02 = extraout_RDX, NAN(untilTime))) {
    pVVar1 = (VTimeZone *)&dstr;
    getDateTimeString((double)fromOffset + untilTime,(UnicodeString *)pVVar1);
    __n = status;
    appendUNTIL(pVVar1,writer,&dstr,status);
    __buf_02 = extraout_RDX_00;
    if (U_ZERO_ERROR < *status) goto LAB_0021a1ad;
  }
  pVVar1 = (VTimeZone *)writer;
  VTZWriter::write(writer,0x30906e,__buf_02,(size_t)__n);
  endZoneProps(pVVar1,writer,isDst,status);
LAB_0021a1ad:
  UnicodeString::~UnicodeString(&dstr);
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOM(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                               int32_t fromOffset, int32_t toOffset,
                               int32_t month, int32_t dayOfMonth, UDate startTime, UDate untilTime,
                               UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    beginZoneProps(writer, isDst, zonename, fromOffset, toOffset, startTime, status);
    if (U_FAILURE(status)) {
        return;
    }
    beginRRULE(writer, month, status);
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BYMONTHDAY);
    writer.write(EQUALS_SIGN);
    UnicodeString dstr;
    appendAsciiDigits(dayOfMonth, 0, dstr);
    writer.write(dstr);
    if (untilTime != MAX_MILLIS) {
        appendUNTIL(writer, getDateTimeString(untilTime + fromOffset, dstr), status);
        if (U_FAILURE(status)) {
            return;
        }
    }
    writer.write(ICAL_NEWLINE);
    endZoneProps(writer, isDst, status);
}